

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpath_selector.hpp
# Opt level: O2

int __thiscall
jsoncons::jsonpath::detail::
slice_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
::select(slice_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
         *this,int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds,
        timeval *__timeout)

{
  size_t sVar1;
  bool bVar2;
  undefined7 extraout_var;
  size_t sVar3;
  size_t index;
  size_t sVar4;
  path_node_type *ppVar5;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *pbVar6;
  size_t extraout_RAX;
  size_t extraout_RAX_00;
  undefined4 in_register_00000034;
  eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *context;
  int64_t i;
  size_t sVar7;
  int64_t i_1;
  result_options in_stack_00000008;
  
  context = (eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
             *)CONCAT44(in_register_00000034,__nfds);
  bVar2 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_array
                    ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)__exceptfds
                    );
  sVar3 = CONCAT71(extraout_var,bVar2);
  if (bVar2) {
    sVar3 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size
                      ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                       __exceptfds);
    index = slice::get_start(&this->slice_,sVar3);
    sVar3 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size
                      ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                       __exceptfds);
    sVar4 = slice::get_stop(&this->slice_,sVar3);
    sVar1 = (this->slice_).step_;
    if ((long)sVar1 < 1) {
      sVar3 = sVar1;
      if ((long)sVar1 < 0) {
        sVar3 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size
                          ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                           __exceptfds);
        if ((long)sVar3 <= (long)index) {
          sVar3 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size
                            ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                             __exceptfds);
          index = sVar3 - 1;
        }
        sVar7 = 0xffffffffffffffff;
        if (-1 < (long)sVar4) {
          sVar7 = sVar4;
        }
        for (; (long)sVar7 < (long)index; index = index + sVar1) {
          sVar3 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size
                            ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                             __exceptfds);
          if (index < sVar3) {
            ppVar5 = path_generator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                     ::generate(context,(path_node_type *)__writefds,index,in_stack_00000008);
            pbVar6 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at
                               ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                                __exceptfds,index);
            base_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
            ::tail_select(&this->
                           super_base_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                          ,context,(reference)__readfds,ppVar5,pbVar6,
                          (node_receiver_type *)__timeout,in_stack_00000008);
            sVar3 = extraout_RAX_00;
          }
        }
      }
    }
    else {
      sVar7 = 0;
      if (0 < (long)index) {
        sVar7 = index;
      }
      sVar3 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size
                        ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                         __exceptfds);
      if ((long)sVar3 < (long)sVar4) {
        sVar3 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size
                          ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                           __exceptfds);
        sVar4 = sVar3;
      }
      for (; (long)sVar7 < (long)sVar4; sVar7 = sVar7 + sVar1) {
        ppVar5 = path_generator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                 ::generate(context,(path_node_type *)__writefds,sVar7,in_stack_00000008);
        pbVar6 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at
                           ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                            __exceptfds,sVar7);
        base_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
        ::tail_select(&this->
                       super_base_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                      ,context,(reference)__readfds,ppVar5,pbVar6,(node_receiver_type *)__timeout,
                      in_stack_00000008);
        sVar3 = extraout_RAX;
      }
    }
  }
  return (int)sVar3;
}

Assistant:

void select(eval_context<Json,JsonReference>& context,
                    reference root,
                    const path_node_type& last, 
                    reference current,
                    node_receiver_type& receiver,
                    result_options options) const override
        {
            if (current.is_array())
            {
                auto start = slice_.get_start(current.size());
                auto end = slice_.get_stop(current.size());
                auto step = slice_.step();

                if (step > 0)
                {
                    if (start < 0)
                    {
                        start = 0;
                    }
                    if (end > static_cast<int64_t>(current.size()))
                    {
                        end = current.size();
                    }
                    for (int64_t i = start; i < end; i += step)
                    {
                        auto j = static_cast<std::size_t>(i);
                        this->tail_select(context, root, 
                                            path_generator_type::generate(context, last, j, options), 
                                            current[j], receiver, options);
                    }
                }
                else if (step < 0)
                {
                    if (start >= static_cast<int64_t>(current.size()))
                    {
                        start = static_cast<int64_t>(current.size()) - 1;
                    }
                    if (end < -1)
                    {
                        end = -1;
                    }
                    for (int64_t i = start; i > end; i += step)
                    {
                        auto j = static_cast<std::size_t>(i);
                        if (j < current.size())
                        {
                            this->tail_select(context, root, 
                                                path_generator_type::generate(context, last,j,options), current[j], receiver, options);
                        }
                    }
                }
            }
        }